

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

void Hacl_Hash_Blake2s_Simd128_init(Lib_IntVector_Intrinsics_vec128 *hash,uint32_t kk,uint32_t nn)

{
  uint32_t uVar1;
  uint32_t iv7_;
  uint32_t iv6_;
  uint32_t iv5_;
  uint32_t iv4_;
  uint32_t iv3_;
  uint32_t iv2_;
  uint32_t iv1_;
  uint32_t iv0_;
  uint32_t tmp7;
  uint32_t tmp6;
  uint32_t tmp5;
  uint32_t tmp4;
  uint32_t tmp3;
  uint32_t tmp2;
  uint32_t tmp1;
  uint32_t tmp0;
  uint32_t x_3;
  uint32_t r_3;
  uint32_t u_3;
  uint8_t *bj_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t r_2;
  uint32_t u_2;
  uint8_t *bj_2;
  uint32_t *os_2;
  uint32_t i_1;
  uint32_t x_1;
  uint32_t r_1;
  uint32_t u_1;
  uint8_t *bj_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t r;
  uint32_t u;
  uint8_t *bj;
  uint32_t *os;
  uint32_t i;
  uint32_t iv7;
  uint32_t iv6;
  uint32_t iv5;
  uint32_t iv4;
  uint32_t iv3;
  uint32_t iv2;
  uint32_t iv1;
  uint32_t iv0;
  Lib_IntVector_Intrinsics_vec128 *r3;
  Lib_IntVector_Intrinsics_vec128 *r2;
  Lib_IntVector_Intrinsics_vec128 *r1;
  Lib_IntVector_Intrinsics_vec128 *r0;
  uint32_t tmp [8];
  Hacl_Hash_Blake2b_blake2_params p;
  uint8_t personal [8];
  uint8_t salt [8];
  uint32_t nn_local;
  uint32_t kk_local;
  Lib_IntVector_Intrinsics_vec128 *hash_local;
  
  personal[0] = '\0';
  personal[1] = '\0';
  personal[2] = '\0';
  personal[3] = '\0';
  personal[4] = '\0';
  personal[5] = '\0';
  personal[6] = '\0';
  personal[7] = '\0';
  p.personal = (uint8_t *)0x0;
  p.digest_length = '\0';
  p.key_length = '\0';
  p.fanout = '\0';
  p.depth = '\0';
  p.leaf_length = 0;
  p.node_offset._0_1_ = 0;
  p.node_offset._1_1_ = 0;
  p._16_8_ = personal;
  p.salt = (uint8_t *)&p.personal;
  hash[2][0] = -0x4498517a95f61999;
  hash[2][1] = -0x5ab00ac5c3910c8e;
  hash[3][0] = -0x64fa9773aef1ad81;
  hash[3][1] = 0x5be0cd191f83d9ab;
  uVar1 = load32((uint8_t *)p._16_8_);
  __uint32_identity(uVar1);
  uVar1 = load32((uint8_t *)(p._16_8_ + 4));
  __uint32_identity(uVar1);
  uVar1 = load32(p.salt);
  __uint32_identity(uVar1);
  uVar1 = load32(p.salt + 4);
  __uint32_identity(uVar1);
  (*hash)[0] = CONCAT44(0xbb67ae85,nn & 0xff | (kk & 0xff) << 8 | 0x1010000) ^ 0x6a09e667;
  (*hash)[1] = CONCAT44(p.leaf_length ^
                        ((uint)(byte)p.node_offset << 0x10 | (uint)p.node_offset._1_1_ << 0x18),
                        p._0_4_) ^ 0xa54ff53a3c6ef372;
  hash[1][0] = -0x64fa9773aef1ad81;
  hash[1][1] = 0x5be0cd191f83d9ab;
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_init(Lib_IntVector_Intrinsics_vec128 *hash, uint32_t kk, uint32_t nn)
{
  uint8_t salt[8U] = { 0U };
  uint8_t personal[8U] = { 0U };
  Hacl_Hash_Blake2b_blake2_params
  p =
    {
      .digest_length = 32U, .key_length = 0U, .fanout = 1U, .depth = 1U, .leaf_length = 0U,
      .node_offset = 0ULL, .node_depth = 0U, .inner_length = 0U, .salt = salt, .personal = personal
    };
  uint32_t tmp[8U] = { 0U };
  Lib_IntVector_Intrinsics_vec128 *r0 = hash;
  Lib_IntVector_Intrinsics_vec128 *r1 = hash + 1U;
  Lib_IntVector_Intrinsics_vec128 *r2 = hash + 2U;
  Lib_IntVector_Intrinsics_vec128 *r3 = hash + 3U;
  uint32_t iv0 = Hacl_Hash_Blake2b_ivTable_S[0U];
  uint32_t iv1 = Hacl_Hash_Blake2b_ivTable_S[1U];
  uint32_t iv2 = Hacl_Hash_Blake2b_ivTable_S[2U];
  uint32_t iv3 = Hacl_Hash_Blake2b_ivTable_S[3U];
  uint32_t iv4 = Hacl_Hash_Blake2b_ivTable_S[4U];
  uint32_t iv5 = Hacl_Hash_Blake2b_ivTable_S[5U];
  uint32_t iv6 = Hacl_Hash_Blake2b_ivTable_S[6U];
  uint32_t iv7 = Hacl_Hash_Blake2b_ivTable_S[7U];
  r2[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv0, iv1, iv2, iv3);
  r3[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv4, iv5, iv6, iv7);
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t *os = tmp + 4U;
    uint8_t *bj = p.salt + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t *os = tmp + 6U;
    uint8_t *bj = p.personal + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  tmp[0U] =
    (uint32_t)(uint8_t)nn
    ^ ((uint32_t)(uint8_t)kk << 8U ^ ((uint32_t)p.fanout << 16U ^ (uint32_t)p.depth << 24U));
  tmp[1U] = p.leaf_length;
  tmp[2U] = (uint32_t)p.node_offset;
  tmp[3U] =
    (uint32_t)(p.node_offset >> 32U)
    ^ ((uint32_t)p.node_depth << 16U ^ (uint32_t)p.inner_length << 24U);
  uint32_t tmp0 = tmp[0U];
  uint32_t tmp1 = tmp[1U];
  uint32_t tmp2 = tmp[2U];
  uint32_t tmp3 = tmp[3U];
  uint32_t tmp4 = tmp[4U];
  uint32_t tmp5 = tmp[5U];
  uint32_t tmp6 = tmp[6U];
  uint32_t tmp7 = tmp[7U];
  uint32_t iv0_ = iv0 ^ tmp0;
  uint32_t iv1_ = iv1 ^ tmp1;
  uint32_t iv2_ = iv2 ^ tmp2;
  uint32_t iv3_ = iv3 ^ tmp3;
  uint32_t iv4_ = iv4 ^ tmp4;
  uint32_t iv5_ = iv5 ^ tmp5;
  uint32_t iv6_ = iv6 ^ tmp6;
  uint32_t iv7_ = iv7 ^ tmp7;
  r0[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv0_, iv1_, iv2_, iv3_);
  r1[0U] = Lib_IntVector_Intrinsics_vec128_load32s(iv4_, iv5_, iv6_, iv7_);
}